

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int cigar_iref2iseq_next(uint32_t **cigar,uint32_t *cigar_max,int *icig,int *iseq,int *iref)

{
  uint uVar1;
  uint uVar2;
  int ncig;
  int cig;
  int *iref_local;
  int *iseq_local;
  int *icig_local;
  uint32_t *cigar_max_local;
  uint32_t **cigar_local;
  
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (cigar_max <= *cigar) {
              *iseq = -1;
              *iref = -1;
              return -1;
            }
            uVar1 = **cigar & 0xf;
            uVar2 = **cigar >> 4;
            if (((uVar1 != 0) && (uVar1 != 7)) && (uVar1 != 8)) break;
            if (*icig < (int)(uVar2 - 1)) {
              *iseq = *iseq + 1;
              *icig = *icig + 1;
              *iref = *iref + 1;
              return 0;
            }
            *icig = 0;
            *cigar = *cigar + 1;
          }
          if ((uVar1 != 2) && (uVar1 != 3)) break;
          *cigar = *cigar + 1;
          *iref = uVar2 + *iref;
          *icig = 0;
        }
        if (uVar1 != 1) break;
        *cigar = *cigar + 1;
        *iseq = uVar2 + *iseq;
        *icig = 0;
      }
      if (uVar1 != 4) break;
      *cigar = *cigar + 1;
      *iseq = uVar2 + *iseq;
      *icig = 0;
    }
    if ((uVar1 != 5) && (uVar1 != 6)) break;
    *cigar = *cigar + 1;
    *icig = 0;
  }
  fprintf(_stderr,"todo: cigar %d\n",(ulong)uVar1);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                ,0x605,"int cigar_iref2iseq_next(uint32_t **, uint32_t *, int *, int *, int *)");
}

Assistant:

static inline int cigar_iref2iseq_next(uint32_t **cigar, uint32_t *cigar_max, int *icig, int *iseq, int *iref)
{
    while ( *cigar < cigar_max )
    {
        int cig  = (**cigar) & BAM_CIGAR_MASK;
        int ncig = (**cigar) >> BAM_CIGAR_SHIFT;

        if ( cig==BAM_CMATCH || cig==BAM_CEQUAL || cig==BAM_CDIFF )
        {
            if ( *icig >= ncig - 1 ) { *icig = 0;  (*cigar)++; continue; }
            (*iseq)++; (*icig)++; (*iref)++;
            return BAM_CMATCH;
        }
        if ( cig==BAM_CDEL || cig==BAM_CREF_SKIP ) { (*cigar)++; (*iref) += ncig; *icig = 0; continue; }
        if ( cig==BAM_CINS ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CSOFT_CLIP ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CHARD_CLIP || cig==BAM_CPAD ) { (*cigar)++; *icig = 0; continue; }
        fprintf(stderr,"todo: cigar %d\n", cig);
        assert(0);
    }
    *iseq = -1;
    *iref = -1;
    return -1;
}